

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
slang::DiagnosticEngine::clearMappings(DiagnosticEngine *this,DiagnosticSeverity severity)

{
  size_t sVar1;
  group_type_pointer pgVar2;
  uint uVar3;
  value_type_pointer ppVar4;
  group_type_pointer pgVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  
  ppVar4 = (this->severityTable).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
           .arrays.elements_;
  if (ppVar4 != (value_type_pointer)0x0) {
    sVar1 = (this->severityTable).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
            .arrays.groups_size_mask;
    pgVar2 = (this->severityTable).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
             .arrays.groups_;
    if (pgVar2 != pgVar2 + sVar1 + 1) {
      sVar6 = (this->severityTable).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
              .size_ctrl.size;
      sVar7 = (this->severityTable).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
              .size_ctrl.ml;
      pgVar5 = pgVar2;
      do {
        auVar10[0] = -(pgVar5->m[0].n == '\0');
        auVar10[1] = -(pgVar5->m[1].n == '\0');
        auVar10[2] = -(pgVar5->m[2].n == '\0');
        auVar10[3] = -(pgVar5->m[3].n == '\0');
        auVar10[4] = -(pgVar5->m[4].n == '\0');
        auVar10[5] = -(pgVar5->m[5].n == '\0');
        auVar10[6] = -(pgVar5->m[6].n == '\0');
        auVar10[7] = -(pgVar5->m[7].n == '\0');
        auVar10[8] = -(pgVar5->m[8].n == '\0');
        auVar10[9] = -(pgVar5->m[9].n == '\0');
        auVar10[10] = -(pgVar5->m[10].n == '\0');
        auVar10[0xb] = -(pgVar5->m[0xb].n == '\0');
        auVar10[0xc] = -(pgVar5->m[0xc].n == '\0');
        auVar10[0xd] = -(pgVar5->m[0xd].n == '\0');
        auVar10[0xe] = -(pgVar5->m[0xe].n == '\0');
        auVar10[0xf] = -(pgVar5->m[0xf].n == '\0');
        for (uVar8 = ((uint)(pgVar2 + sVar1 != pgVar5) << 0xe | 0x3fff) &
                     ~(uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(auVar10[0xf] >> 7) << 0xf); uVar8 != 0;
            uVar8 = uVar8 - 1 & uVar8) {
          uVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          if (ppVar4[uVar3].second == severity) {
            sVar7 = (sVar7 - 1) +
                    (ulong)(((&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::plain_integral>::
                               is_not_overflowed(unsigned_long)::shift)[pgVar5->m[uVar3].n & 7] &
                            *(byte *)((ulong)(pgVar5->m + uVar3) | 0xf)) == 0);
            (this->severityTable).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
            .size_ctrl.ml = sVar7;
            pgVar5->m[uVar3].n = '\0';
            sVar6 = sVar6 - 1;
            (this->severityTable).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
            .size_ctrl.size = sVar6;
          }
        }
        ppVar4 = ppVar4 + 0xf;
        bVar9 = pgVar2 + sVar1 != pgVar5;
        pgVar5 = pgVar5 + 1;
      } while (bVar9);
    }
  }
  return;
}

Assistant:

group_type* groups() const noexcept { return std::to_address(groups_); }